

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O0

void StringTools::split(string *str,char delimiter,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *dest)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_1c0 [8];
  string s;
  istringstream stream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dest_local;
  char delimiter_local;
  string *str_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(s.field_2._M_local_buf + 8),(string *)str,_S_in);
  std::__cxx11::string::string((string *)local_1c0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(s.field_2._M_local_buf + 8),(string *)local_1c0,delimiter);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(dest,(value_type *)local_1c0);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::istringstream::~istringstream((istringstream *)(s.field_2._M_local_buf + 8));
  return;
}

Assistant:

void split(const string& str, char delimiter, vector<string>& dest) {
    istringstream stream(str);
    string s;
    while (getline(stream, s, delimiter)) {
        dest.push_back(s);
    }
}